

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hxx
# Opt level: O3

void __thiscall
stateObservation::
IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::setValue(IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *this,Matrix<double,__1,_1,_0,__1,_1> *v,TimeIndex k)

{
  double *pdVar1;
  double *pdVar2;
  _Map_pointer ppMVar3;
  _Map_pointer ppMVar4;
  _Elt_pointer pMVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  Index index;
  ulong uVar10;
  Index size;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  DenseStorage<double,__1,__1,_1,_0> *this_00;
  
  ppMVar3 = (this->v_).
            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppMVar4 = (this->v_).
            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar11 = ((long)(this->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)(this->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)ppMVar3 - (long)ppMVar4) >> 3) - 1) +
           (ulong)(ppMVar3 == (_Map_pointer)0x0)) * 0x20;
  pMVar5 = (this->v_).
           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar12 = (long)(this->v_).
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar5 >> 4;
  lVar13 = lVar11 + lVar12;
  if (lVar13 == 0) {
LAB_00109e83:
    if (lVar11 + lVar12 == 0) {
      this->k_ = k;
    }
    std::
    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(&this->v_,v);
    return;
  }
  lVar6 = this->k_;
  lVar13 = lVar13 + lVar6;
  if ((k < lVar6) || (lVar13 <= k)) {
    if (lVar13 != k) {
      __assert_fail("(v_.size()==0 || k_+ TimeIndex(v_.size()) == time )&& \"Error: New time instants must be consecutive to existing ones\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                    ,0x1a2,
                    "void stateObservation::IndexedMatrixArrayT<Eigen::Matrix<double, -1, 1>>::checkNext_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, 1>, Allocator = std::allocator<Eigen::Matrix<double, -1, 1>>]"
                   );
    }
    goto LAB_00109e83;
  }
  uVar14 = ((long)pMVar5 -
            (long)(this->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (k - lVar6);
  if ((long)uVar14 < 0) {
    uVar10 = (long)uVar14 >> 5;
  }
  else {
    if (uVar14 < 0x20) {
      this_00 = (DenseStorage<double,__1,__1,_1,_0> *)(pMVar5 + (k - lVar6));
      goto LAB_00109ebe;
    }
    uVar10 = uVar14 >> 5;
  }
  this_00 = (DenseStorage<double,__1,__1,_1,_0> *)(ppMVar4[uVar10] + uVar14 + uVar10 * -0x20);
LAB_00109ebe:
  pdVar7 = (v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar14 = (v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (this_00->m_rows != uVar14) {
    if ((long)uVar14 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize(this_00,uVar14,uVar14,1);
    if (this_00->m_rows != uVar14) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
  }
  pdVar8 = this_00->m_data;
  uVar10 = uVar14 - ((long)uVar14 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar14) {
    lVar11 = 0;
    do {
      pdVar1 = pdVar7 + lVar11;
      dVar9 = pdVar1[1];
      pdVar2 = pdVar8 + lVar11;
      *pdVar2 = *pdVar1;
      pdVar2[1] = dVar9;
      lVar11 = lVar11 + 2;
    } while (lVar11 < (long)uVar10);
  }
  if ((long)uVar10 < (long)uVar14) {
    do {
      pdVar8[uVar10] = pdVar7[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar14 != uVar10);
  }
  return;
}

Assistant:

inline TimeIndex IndexedMatrixArrayT<MatrixType, Allocator>::setLastIndex(int index)
{
  return k_=index-(v_.size()+1);
}